

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O3

void __thiscall Token::Token(Token *this,NumericConstant *value)

{
  this->mType = NUMBER;
  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
            (&(this->mNumericValue).mChars,&value->mChars);
  (this->mNumericValue).mBase = value->mBase;
  this->mCharValue = '\0';
  this->mCharValue2 = '\0';
  (this->mIdentifier)._M_dataplus._M_p = (pointer)&(this->mIdentifier).field_2;
  (this->mIdentifier)._M_string_length = 0;
  (this->mIdentifier).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Token::Token(NumericConstant value)
	: mType(TokenType::NUMBER),
	  mNumericValue(value),
	  mCharValue(0),
	  mCharValue2(0) {

}